

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t farmhash32_cc_with_seed(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  ulong in_RSI;
  undefined8 in_RDI;
  char *unaff_retaddr;
  uint32_t h;
  size_t in_stack_00000020;
  char *in_stack_00000028;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar1 = (uint32_t)((ulong)in_RDI >> 0x20);
  if (in_RSI < 0x19) {
    if (in_RSI < 0xd) {
      if (in_RSI < 5) {
        uVar1 = farmhash32_mk_len_0_to_4
                          (unaff_retaddr,
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),uVar1);
      }
      else {
        uVar1 = farmhash32_mk_len_5_to_12
                          (unaff_retaddr,
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),uVar1);
      }
    }
    else {
      uVar1 = farmhash32_mk_len_13_to_24
                        (unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                         ,uVar1);
    }
  }
  else {
    farmhash32_mk_len_13_to_24
              (unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),uVar1);
    farmhash32_cc(in_stack_00000028,in_stack_00000020);
    uVar1 = mur(0,0x2168d0);
  }
  return uVar1;
}

Assistant:

uint32_t farmhash32_cc_with_seed(const char *s, size_t len, uint32_t seed) {
  if (len <= 24) {
    if (len >= 13) return farmhash32_mk_len_13_to_24(s, len, seed * c1);
    else if (len >= 5) return farmhash32_mk_len_5_to_12(s, len, seed);
    else return farmhash32_mk_len_0_to_4(s, len, seed);
  }
  uint32_t h = farmhash32_mk_len_13_to_24(s, 24, seed ^ len);
  return mur(farmhash32_cc(s + 24, len - 24) + seed, h);
}